

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O0

void empty_opendir_cb(uv_fs_t *req)

{
  void *pvVar1;
  int iVar2;
  undefined8 uVar3;
  int64_t eval_b_4;
  int64_t eval_a_4;
  void *eval_b_3;
  void *eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  int r;
  uv_dir_t *dir;
  uv_fs_t *req_local;
  
  pvVar1 = opendir_req.ptr;
  if (req != &opendir_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x4d,"req","==","&opendir_req",req,"==",&opendir_req);
    abort();
  }
  if ((long)opendir_req.fs_type != 0x1f) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x4e,"req->fs_type","==","UV_FS_OPENDIR",(long)opendir_req.fs_type,"==",0x1f);
    abort();
  }
  if (opendir_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x4f,"req->result","==","0",opendir_req.result,"==",0);
    abort();
  }
  if (opendir_req.ptr == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x50,"req->ptr","!=","NULL",0,"!=",0);
    abort();
  }
  *(uv_dirent_t **)opendir_req.ptr = dirents;
  *(undefined8 *)((long)pvVar1 + 8) = 1;
  uVar3 = uv_default_loop();
  iVar2 = uv_fs_readdir(uVar3,&readdir_req,pvVar1,empty_readdir_cb);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-readdir.c"
            ,0x58,"r","==","0",(long)iVar2,"==",0);
    abort();
  }
  uv_fs_req_cleanup(&opendir_req);
  empty_opendir_cb_count = empty_opendir_cb_count + 1;
  return;
}

Assistant:

static void empty_opendir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT_PTR_EQ(req, &opendir_req);
  ASSERT_EQ(req->fs_type, UV_FS_OPENDIR);
  ASSERT_OK(req->result);
  ASSERT_NOT_NULL(req->ptr);
  dir = req->ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);
  r = uv_fs_readdir(uv_default_loop(),
                    &readdir_req,
                    dir,
                    empty_readdir_cb);
  ASSERT_OK(r);
  uv_fs_req_cleanup(req);
  ++empty_opendir_cb_count;
}